

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGSchemaTypeHave(void *data,xmlChar *type)

{
  xmlSchemaTypePtr pxVar1;
  xmlSchemaTypePtr_conflict typ;
  xmlChar *type_local;
  void *data_local;
  
  if (type == (xmlChar *)0x0) {
    data_local._4_4_ = -1;
  }
  else {
    pxVar1 = xmlSchemaGetPredefinedType(type,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
    if (pxVar1 == (xmlSchemaTypePtr)0x0) {
      data_local._4_4_ = 0;
    }
    else {
      data_local._4_4_ = 1;
    }
  }
  return data_local._4_4_;
}

Assistant:

static int
xmlRelaxNGSchemaTypeHave(void *data ATTRIBUTE_UNUSED, const xmlChar * type)
{
    xmlSchemaTypePtr typ;

    if (type == NULL)
        return (-1);
    typ = xmlSchemaGetPredefinedType(type,
                                     BAD_CAST
                                     "http://www.w3.org/2001/XMLSchema");
    if (typ == NULL)
        return (0);
    return (1);
}